

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinDiff.cc
# Opt level: O3

void print_binary_diff(FILE *stream,void *data1v,size_t size1,void *data2v,size_t size2,
                      bool use_color,size_t context_lines,uint64_t base_offset)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  size_t z;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint16_t diff_flags;
  uint uVar9;
  size_t line_start_offset;
  ulong uVar10;
  anon_class_32_4_ace858be print_diff_line;
  bool local_7d;
  int local_7c;
  ulong local_78;
  FILE *local_70;
  uint8_t *local_68;
  anon_class_32_4_ace858be local_60;
  ulong local_40;
  ulong local_38;
  
  sVar1 = size2;
  if (size2 < size1) {
    sVar1 = size1;
  }
  uVar2 = base_offset + sVar1;
  if (uVar2 < 0x100000001) {
    if (uVar2 < 0x10001) {
      if (uVar2 < 0x101) {
        local_7c = 2;
      }
      else {
        local_7c = 4;
      }
    }
    else {
      local_7c = 8;
    }
  }
  else {
    local_7c = 0x10;
  }
  local_60.use_color = &local_7d;
  local_60.stream = (FILE **)&local_70;
  local_60.base_offset = &base_offset;
  local_60.offset_width_digits = &local_7c;
  local_40 = sVar1 + 0xf >> 4;
  local_7d = use_color;
  local_70 = (FILE *)stream;
  local_68 = (uint8_t *)data2v;
  if (sVar1 + 0xf < 0x10) {
    uVar2 = 0;
  }
  else {
    uVar5 = ~context_lines;
    local_38 = local_40 + (local_40 == 0);
    uVar2 = 0;
    uVar4 = 0;
    do {
      uVar10 = uVar4 * 0x10;
      lVar3 = 0;
      uVar9 = 0;
      do {
        uVar8 = 0xffff;
        uVar6 = 0xffff;
        if (uVar10 + lVar3 < size1) {
          uVar6 = (uint)*(byte *)((long)data1v + lVar3 + uVar10);
        }
        if (uVar10 + lVar3 < size2) {
          uVar8 = (uint)local_68[lVar3 + uVar10];
        }
        uVar7 = 1 << ((byte)lVar3 & 0x1f);
        if (uVar6 == uVar8) {
          uVar7 = 0;
        }
        uVar9 = uVar9 | uVar7;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      diff_flags = (uint16_t)uVar9;
      local_78 = uVar4;
      if (diff_flags == 0) {
        if ((long)(context_lines + uVar5) < (long)uVar4) {
          uVar4 = uVar4 + 1;
        }
        else {
          print_binary_diff::anon_class_32_4_ace858be::operator()
                    (&local_60,' ',(uint8_t *)data1v,size1,uVar4,0,NORMAL);
          uVar2 = uVar4 + 1;
          uVar4 = uVar2;
        }
      }
      else {
        if (uVar2 + context_lines < uVar4) {
          fwrite("  ...\n",6,1,local_70);
          uVar2 = uVar4 - context_lines;
        }
        for (; uVar2 < local_78; uVar2 = uVar2 + 1) {
          print_binary_diff::anon_class_32_4_ace858be::operator()
                    (&local_60,' ',(uint8_t *)data1v,size1,uVar2,0,NORMAL);
        }
        if (uVar10 < size1) {
          print_binary_diff::anon_class_32_4_ace858be::operator()
                    (&local_60,'-',(uint8_t *)data1v,size1,local_78,diff_flags,FG_RED);
        }
        if (uVar10 < size2) {
          print_binary_diff::anon_class_32_4_ace858be::operator()
                    (&local_60,'+',local_68,size2,local_78,diff_flags,FG_GREEN);
        }
        uVar2 = local_78 + 1;
        uVar4 = uVar2;
        uVar5 = local_78;
      }
    } while (uVar4 != local_38);
  }
  if (uVar2 < local_40) {
    fwrite("  ...\n",6,1,local_70);
  }
  return;
}

Assistant:

void print_binary_diff(
    FILE* stream,
    const void* data1v,
    size_t size1,
    const void* data2v,
    size_t size2,
    bool use_color,
    size_t context_lines,
    uint64_t base_offset = 0) {
  const uint8_t* data1 = reinterpret_cast<const uint8_t*>(data1v);
  const uint8_t* data2 = reinterpret_cast<const uint8_t*>(data2v);

  size_t max_data_size = std::max<size_t>(size1, size2);
  int offset_width_digits;
  if (base_offset + max_data_size > 0x100000000) {
    offset_width_digits = 16;
  } else if (base_offset + max_data_size > 0x10000) {
    offset_width_digits = 8;
  } else if (base_offset + max_data_size > 0x100) {
    offset_width_digits = 4;
  } else {
    offset_width_digits = 2;
  }

  auto print_diff_line = [&](char left_ch,
                             const uint8_t* data,
                             size_t size,
                             size_t line_index,
                             uint16_t diff_flags,
                             TerminalFormat color) {
    size_t line_start_offset = line_index * 0x10;
    if (use_color) {
      print_color_escape(stream, color, TerminalFormat::END);
    }
    uint64_t address = base_offset + line_start_offset;
    fprintf(stream, "%c %0*" PRIX64 " |", left_ch, offset_width_digits, address);
    for (size_t within_line_offset = 0; within_line_offset < 0x10; within_line_offset++) {
      size_t offset = (line_index * 0x10) + within_line_offset;
      if (offset < size) {
        if (use_color && (diff_flags & (1 << within_line_offset))) {
          print_color_escape(stream, color, TerminalFormat::BOLD, TerminalFormat::END);
          fprintf(stream, " %02hhX", data[offset]);
          print_color_escape(stream, TerminalFormat::NORMAL, color, TerminalFormat::END);
        } else {
          fprintf(stream, " %02hhX", data[offset]);
        }
      } else {
        fprintf(stream, "   ");
      }
    }
    fprintf(stream, " | ");
    for (size_t within_line_offset = 0; within_line_offset < 0x10; within_line_offset++) {
      size_t offset = (line_index * 0x10) + within_line_offset;
      if (offset < size) {
        char ch = data[offset];
        if (ch < 0x20 || ch > 0x7E) {
          ch = ' ';
        }
        if (use_color && (diff_flags & (1 << within_line_offset))) {
          print_color_escape(stream, color, TerminalFormat::BOLD, TerminalFormat::END);
          fputc(ch, stream);
          print_color_escape(stream, TerminalFormat::NORMAL, color, TerminalFormat::END);
        } else {
          fputc(ch, stream);
        }
      } else {
        fputc(' ', stream);
      }
    }
    if (use_color) {
      print_color_escape(stream, TerminalFormat::NORMAL, TerminalFormat::END);
    }
    fputc('\n', stream);
  };

  auto print_diff_line_pair = [&](size_t line_index, uint16_t diff_flags) -> void {
    size_t line_start_offset = line_index * 0x10;
    if (diff_flags == 0) {
      print_diff_line(' ', data1, size1, line_index, diff_flags, TerminalFormat::NORMAL);
    } else {
      if (line_start_offset < size1) {
        print_diff_line('-', data1, size1, line_index, diff_flags, TerminalFormat::FG_RED);
      }
      if (line_start_offset < size2) {
        print_diff_line('+', data2, size2, line_index, diff_flags, TerminalFormat::FG_GREEN);
      }
    }
  };

  size_t first_unprinted_line_index = 0;
  ssize_t last_different_line_index = -(context_lines + 1);
  size_t num_lines = ((max_data_size + 0x0F) >> 4);
  for (size_t line_index = 0; line_index < num_lines; line_index++) {
    uint16_t diff_flags = 0;
    for (size_t within_line_offset = 0; within_line_offset < 0x10; within_line_offset++) {
      size_t offset = (line_index * 0x10) + within_line_offset;
      uint16_t data1_value = (offset < size1) ? static_cast<uint8_t>(data1[offset]) : 0xFFFF;
      uint16_t data2_value = (offset < size2) ? static_cast<uint8_t>(data2[offset]) : 0xFFFF;
      if (data1_value != data2_value) {
        diff_flags |= (1 << within_line_offset);
      }
    }
    if (diff_flags == 0) {
      if (static_cast<ssize_t>(line_index) <= last_different_line_index + static_cast<ssize_t>(context_lines)) {
        print_diff_line_pair(line_index, diff_flags);
        first_unprinted_line_index = line_index + 1;
      }

    } else {
      bool has_unprinted_gap;
      size_t chunk_start_line_index;
      if ((first_unprinted_line_index + context_lines) >= line_index) {
        chunk_start_line_index = first_unprinted_line_index;
        has_unprinted_gap = false;
      } else {
        chunk_start_line_index = line_index - context_lines;
        has_unprinted_gap = true;
      }

      if (has_unprinted_gap) {
        fprintf(stream, "  ...\n");
      }

      for (size_t z = chunk_start_line_index; z < line_index; z++) {
        print_diff_line_pair(z, 0x0000);
      }
      print_diff_line_pair(line_index, diff_flags);
      first_unprinted_line_index = line_index + 1;
      last_different_line_index = line_index;
    }
  }

  if (first_unprinted_line_index < num_lines) {
    fprintf(stream, "  ...\n");
  }
}